

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O1

size_t duckdb_zstd::ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  U32 UVar4;
  seqDef *psVar5;
  bool bVar6;
  undefined8 uVar7;
  seqStore_t *psVar8;
  uint uVar9;
  int iVar10;
  size_t sVar11;
  ulong uVar12;
  BYTE *pBVar13;
  uint uVar14;
  BYTE *mEnd;
  BYTE *pBVar15;
  U32 UVar16;
  char *pcVar17;
  ulong uVar18;
  ulong uVar19;
  int *ip;
  uint uVar20;
  ulong uVar21;
  BYTE *pBVar22;
  int iVar23;
  int *piVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  size_t ofbCandidate;
  U32 maxDistance;
  BYTE *litLimit_w;
  uint local_f4;
  int *local_f0;
  size_t local_e0;
  BYTE *local_d8;
  int *local_d0;
  ulong local_c8;
  int local_c0;
  uint local_bc;
  BYTE *local_b8;
  BYTE *local_b0;
  BYTE *local_a8;
  BYTE *local_a0;
  ulong local_98;
  int *local_90;
  int *local_88;
  ulong local_80;
  U32 *local_78;
  BYTE *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  seqStore_t *local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_d8 = (BYTE *)((long)src + srcSize);
  local_90 = (int *)((long)src + (srcSize - 8));
  pBVar15 = (ms->window).base;
  pBVar13 = (ms->window).dictBase;
  uVar14 = (ms->window).dictLimit;
  uVar12 = (ulong)uVar14;
  local_b8 = pBVar15 + uVar12;
  uVar9 = (ms->window).lowLimit;
  uVar2 = (ms->cParams).windowLog;
  uVar3 = (ms->cParams).minMatch;
  uVar20 = 6;
  if (uVar3 < 6) {
    uVar20 = uVar3;
  }
  local_bc = 4;
  if (4 < uVar20) {
    local_bc = uVar20;
  }
  uVar21 = (ulong)*rep;
  local_f4 = rep[1];
  ms->lazySkipping = 0;
  piVar24 = (int *)((ulong)(local_b8 == (BYTE *)src) + (long)src);
  local_d0 = (int *)src;
  local_78 = rep;
  if (piVar24 < local_90) {
    local_a0 = pBVar13 + uVar12;
    local_70 = pBVar13 + uVar9;
    uVar9 = 1 << ((byte)uVar2 & 0x1f);
    local_98 = (ulong)uVar9;
    iVar25 = uVar14 - 1;
    local_88 = (int *)(local_d8 + -0x20);
    iVar10 = (int)pBVar15;
    local_60 = (ulong)(1 - (uVar9 + iVar10));
    local_58 = (ulong)(1 - iVar10);
    local_68 = (ulong)((uVar14 + iVar10) - 2);
    local_c8 = uVar12;
    local_c0 = iVar25;
    local_b0 = pBVar15;
    local_a8 = pBVar13;
    local_50 = seqStore;
    do {
      pBVar22 = local_d8;
      iVar23 = (int)piVar24;
      iVar10 = (iVar23 - (int)pBVar15) + 1;
      UVar4 = (ms->window).lowLimit;
      UVar16 = iVar10 - (uint)local_98;
      if (iVar10 - UVar4 <= (uint)local_98) {
        UVar16 = UVar4;
      }
      if (ms->loadedDictEnd != 0) {
        UVar16 = UVar4;
      }
      uVar14 = iVar10 - (uint)uVar21;
      if (uVar14 < (uint)uVar12) {
        pBVar15 = pBVar13;
      }
      local_80 = uVar21;
      if (iVar25 - uVar14 < 3) {
        uVar19 = 0;
      }
      else {
        uVar19 = 0;
        if ((uint)uVar21 <= iVar10 - UVar16) {
          if (*(int *)((long)piVar24 + 1) == *(int *)(pBVar15 + uVar14)) {
            mEnd = local_d8;
            if (uVar14 < (uint)uVar12) {
              mEnd = local_a0;
            }
            sVar11 = ZSTD_count_2segments
                               ((BYTE *)((long)piVar24 + 5),(BYTE *)((long)(pBVar15 + uVar14) + 4),
                                local_d8,mEnd,local_b8);
            uVar19 = sVar11 + 4;
          }
          else {
            uVar19 = 0;
          }
        }
      }
      local_e0 = 999999999;
      if (local_bc == 6) {
        uVar12 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)piVar24,pBVar22,&local_e0);
      }
      else if (local_bc == 5) {
        uVar12 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)piVar24,pBVar22,&local_e0);
      }
      else {
        uVar12 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)piVar24,pBVar22,&local_e0);
      }
      uVar27 = uVar19;
      if (uVar19 < uVar12) {
        uVar27 = uVar12;
      }
      if (uVar27 < 4) {
        uVar12 = (long)piVar24 - (long)local_d0;
        piVar24 = (int *)((long)piVar24 + (uVar12 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar12);
        uVar12 = local_c8;
        uVar21 = local_80;
        pBVar15 = local_b0;
      }
      else {
        local_f0 = piVar24;
        uVar18 = local_e0;
        if (uVar12 <= uVar19) {
          local_f0 = (int *)((long)piVar24 + 1);
          uVar18 = 1;
        }
        local_38 = (ulong)(uint)((int)local_60 + iVar23);
        uVar14 = (int)local_58 + iVar23;
        local_40 = (ulong)uVar14;
        uVar9 = ((int)local_68 + (int)local_80) - iVar23;
        local_48 = (ulong)(uVar14 - (int)local_80);
        lVar26 = 0;
        do {
          if (local_90 <= (int *)(lVar26 + (long)piVar24)) break;
          ip = (int *)((long)piVar24 + lVar26 + 1);
          if (uVar18 == 0) {
            uVar18 = 0;
          }
          else {
            UVar4 = (ms->window).lowLimit;
            iVar10 = (int)lVar26;
            iVar25 = (int)local_40 + iVar10;
            UVar16 = (int)local_38 + iVar10;
            if (iVar25 - UVar4 <= (uint)local_98) {
              UVar16 = UVar4;
            }
            if (ms->loadedDictEnd != 0) {
              UVar16 = UVar4;
            }
            uVar14 = (int)local_48 + iVar10;
            pBVar15 = local_b0;
            if (uVar14 < (uint)local_c8) {
              pBVar15 = local_a8;
            }
            if (((2 < uVar9) && ((uint)local_80 <= iVar25 - UVar16)) &&
               (*ip == *(int *)(pBVar15 + uVar14))) {
              pBVar13 = local_d8;
              if (uVar14 < (uint)local_c8) {
                pBVar13 = local_a0;
              }
              sVar11 = ZSTD_count_2segments
                                 ((BYTE *)((long)piVar24 + lVar26 + 5),
                                  (BYTE *)((long)(pBVar15 + uVar14) + 4),local_d8,pBVar13,local_b8);
              if (sVar11 < 0xfffffffffffffffc) {
                uVar14 = 0x1f;
                if ((uint)uVar18 != 0) {
                  for (; (uint)uVar18 >> uVar14 == 0; uVar14 = uVar14 - 1) {
                  }
                }
                if ((int)((uVar14 ^ 0x1f) + (int)uVar27 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
                  uVar18 = 1;
                  uVar27 = sVar11 + 4;
                  local_f0 = ip;
                }
              }
            }
          }
          local_e0 = 999999999;
          if (local_bc == 6) {
            uVar12 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)ip,local_d8,&local_e0);
          }
          else if (local_bc == 5) {
            uVar12 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)ip,local_d8,&local_e0);
          }
          else {
            uVar12 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)ip,local_d8,&local_e0);
          }
          bVar6 = true;
          if (3 < uVar12) {
            uVar14 = 0x1f;
            if ((uint)uVar18 != 0) {
              for (; (uint)uVar18 >> uVar14 == 0; uVar14 = uVar14 - 1) {
              }
            }
            iVar25 = 0x1f;
            if ((uint)local_e0 != 0) {
              for (; (uint)local_e0 >> iVar25 == 0; iVar25 = iVar25 + -1) {
              }
            }
            if ((int)((uVar14 ^ 0x1f) + (int)uVar27 * 4 + -0x1b) < (int)uVar12 * 4 - iVar25) {
              bVar6 = false;
              uVar18 = local_e0;
              uVar27 = uVar12;
              local_f0 = ip;
            }
          }
          lVar26 = lVar26 + 1;
          uVar9 = uVar9 - 1;
        } while (!bVar6);
        psVar8 = local_50;
        if (uVar18 < 4) {
          uVar19 = (ulong)local_f4;
          uVar21 = local_80;
        }
        else {
          pcVar17 = (char *)((long)local_f0 + (3 - (long)(local_b0 + uVar18)));
          pBVar13 = local_b8;
          pBVar15 = local_b0;
          if ((uint)pcVar17 < (uint)local_c8) {
            pBVar13 = local_70;
            pBVar15 = local_a8;
          }
          if ((local_d0 < local_f0) &&
             (uVar12 = (ulong)pcVar17 & 0xffffffff, pBVar13 < pBVar15 + uVar12)) {
            pBVar15 = pBVar15 + uVar12;
            do {
              piVar24 = (int *)((long)local_f0 + -1);
              pBVar15 = pBVar15 + -1;
              if ((*(BYTE *)piVar24 != *pBVar15) ||
                 (uVar27 = uVar27 + 1, local_f0 = piVar24, piVar24 <= local_d0)) break;
            } while (pBVar13 < pBVar15);
          }
          uVar19 = local_80 & 0xffffffff;
          uVar21 = (ulong)((U32)uVar18 - 3);
        }
        uVar12 = (long)local_f0 - (long)local_d0;
        if (local_88 < local_f0) {
          ZSTD_safecopyLiterals(local_50->lit,(BYTE *)local_d0,(BYTE *)local_f0,(BYTE *)local_88);
        }
        else {
          pBVar15 = local_50->lit;
          uVar7 = *(undefined8 *)(local_d0 + 2);
          *(undefined8 *)pBVar15 = *(undefined8 *)local_d0;
          *(undefined8 *)(pBVar15 + 8) = uVar7;
          if (0x10 < uVar12) {
            pBVar15 = local_50->lit;
            uVar7 = *(undefined8 *)(local_d0 + 6);
            *(undefined8 *)(pBVar15 + 0x10) = *(undefined8 *)(local_d0 + 4);
            *(undefined8 *)(pBVar15 + 0x18) = uVar7;
            if (0x20 < (long)uVar12) {
              lVar26 = 0;
              do {
                puVar1 = (undefined8 *)((long)local_d0 + lVar26 + 0x20);
                uVar7 = puVar1[1];
                pBVar13 = pBVar15 + lVar26 + 0x20;
                *(undefined8 *)pBVar13 = *puVar1;
                *(undefined8 *)(pBVar13 + 8) = uVar7;
                puVar1 = (undefined8 *)((long)local_d0 + lVar26 + 0x30);
                uVar7 = puVar1[1];
                *(undefined8 *)(pBVar13 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar13 + 0x18) = uVar7;
                lVar26 = lVar26 + 0x20;
              } while (pBVar13 + 0x20 < pBVar15 + uVar12);
            }
          }
        }
        pBVar15 = local_b0;
        psVar8->lit = psVar8->lit + uVar12;
        if (0xffff < uVar12) {
          psVar8->longLengthType = ZSTD_llt_literalLength;
          psVar8->longLengthPos =
               (U32)((ulong)((long)psVar8->sequences - (long)psVar8->sequencesStart) >> 3);
        }
        psVar5 = psVar8->sequences;
        psVar5->litLength = (U16)uVar12;
        psVar5->offBase = (U32)uVar18;
        if (0xffff < uVar27 - 3) {
          psVar8->longLengthType = ZSTD_llt_matchLength;
          psVar8->longLengthPos = (U32)((ulong)((long)psVar5 - (long)psVar8->sequencesStart) >> 3);
        }
        psVar5->mlBase = (U16)(uVar27 - 3);
        psVar8->sequences = psVar5 + 1;
        if (ms->lazySkipping != 0) {
          ms->lazySkipping = 0;
        }
        piVar24 = (int *)((long)local_f0 + uVar27);
        pBVar13 = local_a8;
        uVar12 = local_c8;
        iVar25 = local_c0;
        local_d0 = piVar24;
        do {
          local_f4 = (uint)uVar19;
          if (local_90 < piVar24) break;
          iVar10 = (int)piVar24 - (int)pBVar15;
          UVar4 = (ms->window).lowLimit;
          UVar16 = iVar10 - (uint)local_98;
          if (iVar10 - UVar4 <= (uint)local_98) {
            UVar16 = UVar4;
          }
          if (ms->loadedDictEnd != 0) {
            UVar16 = UVar4;
          }
          uVar14 = iVar10 - local_f4;
          pBVar22 = pBVar15;
          if (uVar14 < (uint)uVar12) {
            pBVar22 = pBVar13;
          }
          uVar9 = (uint)uVar21;
          if (((iVar25 - uVar14 < 3) || (iVar10 - UVar16 < local_f4)) ||
             (*piVar24 != *(int *)(pBVar22 + uVar14))) {
            bVar6 = false;
            uVar14 = local_f4;
          }
          else {
            pBVar13 = local_d8;
            if (uVar14 < (uint)uVar12) {
              pBVar13 = local_a0;
            }
            sVar11 = ZSTD_count_2segments
                               ((BYTE *)(piVar24 + 1),(BYTE *)((long)(pBVar22 + uVar14) + 4),
                                local_d8,pBVar13,local_b8);
            pBVar13 = psVar8->lit;
            if (local_88 < local_d0) {
              ZSTD_safecopyLiterals(pBVar13,(BYTE *)local_d0,(BYTE *)local_d0,(BYTE *)local_88);
            }
            else {
              uVar7 = *(undefined8 *)(local_d0 + 2);
              *(undefined8 *)pBVar13 = *(undefined8 *)local_d0;
              *(undefined8 *)(pBVar13 + 8) = uVar7;
            }
            psVar5 = psVar8->sequences;
            psVar5->litLength = 0;
            psVar5->offBase = 1;
            if (0xffff < sVar11 + 1) {
              psVar8->longLengthType = ZSTD_llt_matchLength;
              psVar8->longLengthPos =
                   (U32)((ulong)((long)psVar5 - (long)psVar8->sequencesStart) >> 3);
            }
            psVar5->mlBase = (U16)(sVar11 + 1);
            psVar8->sequences = psVar5 + 1;
            piVar24 = (int *)((long)piVar24 + sVar11 + 4);
            bVar6 = true;
            pBVar13 = local_a8;
            uVar12 = local_c8;
            iVar25 = local_c0;
            uVar14 = uVar9;
            uVar9 = local_f4;
            local_d0 = piVar24;
          }
          local_f4 = uVar14;
          uVar21 = (ulong)uVar9;
          uVar19 = (ulong)local_f4;
        } while (bVar6);
      }
    } while (piVar24 < local_90);
  }
  *local_78 = (U32)uVar21;
  local_78[1] = local_f4;
  return (long)local_d8 - (long)local_d0;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}